

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyQueryPoolResults
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t firstQuery,uint32_t queryCount,
          VkBuffer dstBuffer,VkDeviceSize dstOffset,VkDeviceSize stride,VkQueryResultFlags flags)

{
  undefined4 in_register_0000000c;
  string msg;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,queryCount));
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyQueryPoolResults",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x295);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    if ((this->m_State).DynamicRenderingHash != 0) {
      EndRendering(this);
    }
  }
  else {
    EndRenderPass(this);
  }
  FlushBarriers(this);
  (*vkCmdCopyQueryPoolResults)
            (this->m_VkCmdBuffer,queryPool,firstQuery,queryCount,dstBuffer,dstOffset,stride,flags);
  return;
}

Assistant:

__forceinline void CopyQueryPoolResults(VkQueryPool        queryPool,
                                            uint32_t           firstQuery,
                                            uint32_t           queryCount,
                                            VkBuffer           dstBuffer,
                                            VkDeviceSize       dstOffset,
                                            VkDeviceSize       stride,
                                            VkQueryResultFlags flags)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy query results must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyQueryPoolResults(m_VkCmdBuffer, queryPool, firstQuery, queryCount,
                                  dstBuffer, dstOffset, stride, flags);
    }